

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O1

void __thiscall
math::wide_integer::uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
eval_divide_by_single_limb
          (uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *this,
          limb_type short_denominator,unsigned_fast_type u_offset,
          uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *remainder)

{
  pointer pvVar1;
  ulong uVar2;
  pointer __s;
  long lVar3;
  ulong uVar4;
  int iVar5;
  
  if (u_offset << 0x20 == 0x20000000000) {
    uVar4 = 0;
    iVar5 = 0;
  }
  else {
    pvVar1 = (this->values).
             super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
             elems;
    lVar3 = (long)(0x20000000000 - (u_offset << 0x20)) >> 0x1e;
    uVar2 = 0;
    uVar4 = 0;
    do {
      uVar4 = CONCAT44((int)uVar4 - (int)uVar2 * short_denominator,
                       *(undefined4 *)((long)pvVar1 + lVar3 + -4));
      uVar2 = uVar4 / short_denominator;
      iVar5 = (int)uVar2;
      *(int *)((long)pvVar1 + lVar3 + -4) = iVar5;
      lVar3 = lVar3 + -4;
    } while (lVar3 != 0);
  }
  if (remainder != (uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)0x0) {
    __s = (pointer)operator_new(0x800);
    memset(__s,0,0x800);
    memset(__s,0,0x800);
    *__s = (int)uVar4 - iVar5 * short_denominator;
    uVar2 = (ulong)(remainder->values).
                   super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                   .elem_count;
    (remainder->values).
    super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elem_count =
         0x200;
    pvVar1 = (remainder->values).
             super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
             elems;
    (remainder->values).
    super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems = __s;
    if (uVar2 != 0) {
      operator_delete(pvVar1,uVar2 << 2);
      return;
    }
  }
  return;
}

Assistant:

constexpr auto eval_divide_by_single_limb(const limb_type          short_denominator,
                                              const unsigned_fast_type u_offset,
                                                    uintwide_t*        remainder) -> void
    {
      // The denominator has one single limb.
      // Use a one-dimensional division algorithm.

      auto long_numerator = double_limb_type { };
      auto hi_part        = static_cast<limb_type>(UINT8_C(0));

      {
        reverse_iterator
          ri
          {
            detail::advance_and_point
            (
              values.begin(),
              static_cast<size_t>(number_of_limbs - static_cast<size_t>(u_offset))
            )
          };

        for( ; ri != values.rend(); ++ri) // NOLINT(altera-id-dependent-backward-branch)
        {
          long_numerator =
            static_cast<double_limb_type>
            (
               *ri
             + static_cast<double_limb_type>
               (
                    static_cast<double_limb_type>
                    (
                        long_numerator
                      - static_cast<double_limb_type>(static_cast<double_limb_type>(short_denominator) * hi_part)
                    )
                 << static_cast<unsigned>(std::numeric_limits<limb_type>::digits)
               )
            );

          *ri = detail::make_lo<limb_type>(static_cast<double_limb_type>(long_numerator / short_denominator));

          hi_part = *ri;
        }
      }

      if(remainder != nullptr)
      {
        long_numerator =
          static_cast<double_limb_type>
          (
             static_cast<double_limb_type>(*values.cbegin())
           + static_cast<double_limb_type>
             (
                  static_cast<double_limb_type>
                  (
                    long_numerator - static_cast<double_limb_type>(static_cast<double_limb_type>(short_denominator) * hi_part)
                  )
               << static_cast<unsigned>(std::numeric_limits<limb_type>::digits)
             )
          );

        *remainder =
          static_cast<limb_type>
          (
            long_numerator >> static_cast<unsigned>(std::numeric_limits<limb_type>::digits)
          );
      }
    }